

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap2Local.cpp
# Opt level: O2

void __thiscall
wasm::anon_unknown_23::Struct2Local::adjustTypeFlowingThrough(Struct2Local *this,Expression *curr)

{
  ulong uVar1;
  ParentChildInteraction PVar2;
  HeapType heapType;
  Type local_20;
  
  PVar2 = EscapeAnalyzer::getInteraction(this->analyzer,curr);
  if (PVar2 == Flows) {
    uVar1 = (curr->type).id;
    if ((uVar1 < 7) || ((uVar1 & 1) != 0)) {
      __assert_fail("curr->type.isRef()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Heap2Local.cpp"
                    ,0x27d,
                    "void wasm::(anonymous namespace)::Struct2Local::adjustTypeFlowingThrough(Expression *)"
                   );
    }
    heapType = wasm::Type::getHeapType(&curr->type);
    wasm::Type::Type(&local_20,heapType,Nullable,Inexact);
    (curr->type).id = local_20.id;
  }
  return;
}

Assistant:

void adjustTypeFlowingThrough(Expression* curr) {
    if (analyzer.getInteraction(curr) != ParentChildInteraction::Flows) {
      return;
    }

    // Our allocation passes through this expr. We must turn its type into a
    // nullable one, because we will remove things like RefAsNonNull of it,
    // which means we may no longer have a non-nullable value as our input,
    // and we could fail to validate. It is safe to make this change in terms
    // of our parent, since we know very specifically that only safe things
    // will end up using our value, like a StructGet or a Drop, which do not
    // care about non-nullability.
    assert(curr->type.isRef());
    curr->type = Type(curr->type.getHeapType(), Nullable);
  }